

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

void TTD::NSSnapValues::AssertSnapEquiv
               (SnapPromiseCapabilityInfo *capabilityInfo1,
               SnapPromiseCapabilityInfo *capabilityInfo2,TTDCompareMap *compareMap)

{
  TTDCompareMap::CheckConsistentAndAddPtrIdMapping_NoEnqueue
            (compareMap,capabilityInfo1->CapabilityId,capabilityInfo2->CapabilityId);
  AssertSnapEquivTTDVar_Special
            (capabilityInfo1->PromiseVar,capabilityInfo2->PromiseVar,compareMap,L"promiseVar");
  AssertSnapEquivTTDVar_Special
            (capabilityInfo1->ResolveVar,capabilityInfo2->ResolveVar,compareMap,L"resolveObjId");
  AssertSnapEquivTTDVar_Special
            (capabilityInfo1->RejectVar,capabilityInfo2->RejectVar,compareMap,L"rejectObjId");
  return;
}

Assistant:

void AssertSnapEquiv(const SnapPromiseCapabilityInfo* capabilityInfo1, const SnapPromiseCapabilityInfo* capabilityInfo2, TTDCompareMap& compareMap)
        {
            compareMap.CheckConsistentAndAddPtrIdMapping_NoEnqueue(capabilityInfo1->CapabilityId, capabilityInfo2->CapabilityId);

            AssertSnapEquivTTDVar_Special(capabilityInfo1->PromiseVar, capabilityInfo2->PromiseVar, compareMap, _u("promiseVar"));
            AssertSnapEquivTTDVar_Special(capabilityInfo1->ResolveVar, capabilityInfo2->ResolveVar, compareMap, _u("resolveObjId"));
            AssertSnapEquivTTDVar_Special(capabilityInfo1->RejectVar, capabilityInfo2->RejectVar, compareMap, _u("rejectObjId"));
        }